

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O3

bool Assimp::PLY::PropertyInstance::ParseInstance
               (char **pCur,Property *prop,PropertyInstance *p_pcOut)

{
  pointer *ppVVar1;
  EDataType EVar2;
  iterator __position;
  ValueUnion in_RAX;
  byte *pbVar3;
  ulong uVar4;
  ValueUnion v;
  ValueUnion local_38;
  
  if (prop == (Property *)0x0) {
    __assert_fail("__null != prop",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyParser.cpp"
                  ,0x343,
                  "static bool Assimp::PLY::PropertyInstance::ParseInstance(const char *&, const PLY::Property *, PLY::PropertyInstance *)"
                 );
  }
  if (p_pcOut == (PropertyInstance *)0x0) {
    __assert_fail("__null != p_pcOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Ply/PlyParser.cpp"
                  ,0x344,
                  "static bool Assimp::PLY::PropertyInstance::ParseInstance(const char *&, const PLY::Property *, PLY::PropertyInstance *)"
                 );
  }
  for (pbVar3 = (byte *)*pCur; (*pbVar3 == 0x20 || (*pbVar3 == 9)); pbVar3 = pbVar3 + 1) {
  }
  *pCur = (char *)pbVar3;
  if ((*pbVar3 < 0xe) && ((0x3401U >> (*pbVar3 & 0x1f) & 1) != 0)) {
    return false;
  }
  local_38 = in_RAX;
  if (prop->bIsList == true) {
    ParseValue(pCur,prop->eFirstType,&local_38);
    EVar2 = prop->eFirstType;
    if (EDT_UInt < EVar2) {
      if (EVar2 == EDT_Float) {
        local_38 = (ValueUnion)(long)local_38.fFloat;
      }
      else {
        if (EVar2 != EDT_Double) {
          std::
          vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
          ::resize(&p_pcOut->avList,0);
          goto LAB_00493afe;
        }
        local_38 = (ValueUnion)(long)local_38.fDouble;
      }
    }
    std::
    vector<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
    ::resize(&p_pcOut->avList,(ulong)local_38 & 0xffffffff);
    if (local_38.iUInt != 0) {
      uVar4 = 0;
      do {
        for (pbVar3 = (byte *)*pCur; (*pbVar3 == 0x20 || (*pbVar3 == 9)); pbVar3 = pbVar3 + 1) {
        }
        *pCur = (char *)pbVar3;
        if ((*pbVar3 < 0xe) && ((0x3401U >> (*pbVar3 & 0x1f) & 1) != 0)) {
          return false;
        }
        ParseValue(pCur,prop->eType,
                   (p_pcOut->avList).
                   super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar4);
        uVar4 = uVar4 + 1;
      } while (uVar4 != ((ulong)local_38 & 0xffffffff));
    }
  }
  else {
    ParseValue(pCur,prop->eType,&local_38);
    __position._M_current =
         (p_pcOut->avList).
         super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (p_pcOut->avList).
        super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Assimp::PLY::PropertyInstance::ValueUnion,std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>>
      ::_M_realloc_insert<Assimp::PLY::PropertyInstance::ValueUnion_const&>
                ((vector<Assimp::PLY::PropertyInstance::ValueUnion,std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>>
                  *)p_pcOut,__position,&local_38);
    }
    else {
      *__position._M_current = local_38;
      ppVVar1 = &(p_pcOut->avList).
                 super__Vector_base<Assimp::PLY::PropertyInstance::ValueUnion,_std::allocator<Assimp::PLY::PropertyInstance::ValueUnion>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppVVar1 = *ppVVar1 + 1;
    }
  }
LAB_00493afe:
  pbVar3 = (byte *)*pCur;
  while (((ulong)*pbVar3 < 0x21 && ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
    pbVar3 = pbVar3 + 1;
  }
  *pCur = (char *)pbVar3;
  return true;
}

Assistant:

bool PLY::PropertyInstance::ParseInstance(const char* &pCur,
  const PLY::Property* prop, PLY::PropertyInstance* p_pcOut)
{
  ai_assert(NULL != prop);
  ai_assert(NULL != p_pcOut);

  // skip spaces at the beginning
  if (!SkipSpaces(&pCur))
  {
    return false;
  }

  if (prop->bIsList)
  {
    // parse the number of elements in the list
    PLY::PropertyInstance::ValueUnion v;
    PLY::PropertyInstance::ParseValue(pCur, prop->eFirstType, &v);

    // convert to unsigned int
    unsigned int iNum = PLY::PropertyInstance::ConvertTo<unsigned int>(v, prop->eFirstType);

    // parse all list elements
    p_pcOut->avList.resize(iNum);
    for (unsigned int i = 0; i < iNum; ++i)
    {
      if (!SkipSpaces(&pCur))
        return false;

      PLY::PropertyInstance::ParseValue(pCur, prop->eType, &p_pcOut->avList[i]);
    }
  }
  else
  {
    // parse the property
    PLY::PropertyInstance::ValueUnion v;

    PLY::PropertyInstance::ParseValue(pCur, prop->eType, &v);
    p_pcOut->avList.push_back(v);
  }
  SkipSpacesAndLineEnd(&pCur);
  return true;
}